

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_string_utils.c
# Opt level: O1

int coda__pcre2_strcmp_c8_8(PCRE2_SPTR8 str1,char *str2)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  
  lVar3 = 0;
  while ((bVar2 = str1[lVar3], bVar2 != 0 || (str2[lVar3] != '\0'))) {
    pbVar1 = (byte *)(str2 + lVar3);
    lVar3 = lVar3 + 1;
    if (bVar2 != *pbVar1) {
      return (*pbVar1 < bVar2) - 1 | 1;
    }
  }
  return 0;
}

Assistant:

int
PRIV(strcmp_c8)(PCRE2_SPTR str1, const char *str2)
{
PCRE2_UCHAR c1, c2;
while (*str1 != '\0' || *str2 != '\0')
  {
  c1 = *str1++;
  c2 = *str2++;
  if (c1 != c2) return ((c1 > c2) << 1) - 1;
  }
return 0;
}